

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

unique_ptr<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_> __thiscall
groundupdbext::EmbeddedDatabase::Impl::createEmpty(Impl *this,string *dbname)

{
  bool bVar1;
  string dbfolder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string basedir;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&basedir,".groundupdb",(allocator<char> *)&dbfolder);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&dbfolder,&basedir,auto_format);
  bVar1 = std::filesystem::exists((path *)&dbfolder);
  std::filesystem::__cxx11::path::~path((path *)&dbfolder);
  if (!bVar1) {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)&dbfolder,&basedir,auto_format);
    std::filesystem::create_directory((path *)&dbfolder);
    std::filesystem::__cxx11::path::~path((path *)&dbfolder);
  }
  std::operator+(&local_60,&basedir,"/");
  std::operator+(&dbfolder,&local_60,dbname);
  std::__cxx11::string::~string((string *)&local_60);
  std::
  make_unique<groundupdbext::EmbeddedDatabase::Impl,std::__cxx11::string&,std::__cxx11::string&>
            (&local_60,dbname);
  (this->super_IDatabase)._vptr_IDatabase = (_func_int **)local_60._M_dataplus._M_p;
  std::__cxx11::string::~string((string *)&dbfolder);
  std::__cxx11::string::~string((string *)&basedir);
  return (__uniq_ptr_data<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>,_true,_true>
          )(__uniq_ptr_data<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>,_true,_true>
            )this;
}

Assistant:

const std::unique_ptr<IDatabase> EmbeddedDatabase::Impl::createEmpty(std::string dbname) {
  std::string basedir(".groundupdb");
  if (!fs::exists(basedir)) {
      fs::create_directory(basedir);
  }
  std::string dbfolder(basedir + "/" + dbname);
  return std::make_unique<EmbeddedDatabase::Impl>(dbname,dbfolder);
}